

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13ad8::testSetSampleCounts(Box2i *dataWindow)

{
  int iVar1;
  ostream *poVar2;
  TypedDeepImageChannel<float> *pTVar3;
  size_t sVar4;
  uint *puVar5;
  long lVar6;
  float *pfVar7;
  int *in_RDI;
  float fVar8;
  int j_3;
  int j_2;
  int j_1;
  int j;
  float oldSamples [20];
  int newN;
  int oldN;
  int y;
  int x;
  size_t i;
  int MAX_SAMPLES;
  SampleCountChannel *sampleCounts;
  DeepFloatChannel *channel;
  DeepImageLevel *level;
  Rand48 random;
  DeepImage img;
  unsigned_long in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  string *in_stack_fffffffffffffdf8;
  DeepImageLevel *in_stack_fffffffffffffe00;
  allocator<char> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  ulong uVar9;
  string *in_stack_fffffffffffffe58;
  Image *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe80;
  char *dataWindow_00;
  Image *this;
  int local_168;
  uint local_164;
  int local_160;
  int local_15c;
  float afStack_158 [11];
  uint in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  SampleCountChannel *in_stack_fffffffffffffee0;
  ulong local_f8;
  allocator<char> local_d9;
  string local_d8 [32];
  TypedDeepImageChannel<float> *local_b8;
  DeepImageLevel *local_b0;
  allocator<char> local_a1;
  string local_a0 [48];
  Image local_70;
  int *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"change sample counts, data window = (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_8);
  dataWindow_00 = ", ";
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8[1]);
  poVar2 = std::operator<<(poVar2,") - (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8[2]);
  poVar2 = std::operator<<(poVar2,dataWindow_00);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8[3]);
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this = &local_70;
  Imf_2_5::DeepImage::DeepImage((DeepImage *)in_stack_fffffffffffffe20);
  Imf_2_5::Image::resize
            (this,(Box2i *)dataWindow_00,(LevelMode)((ulong)in_stack_fffffffffffffe80 >> 0x20),
             (LevelRoundingMode)in_stack_fffffffffffffe80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (PixelType)((ulong)in_stack_fffffffffffffe50 >> 0x20),(int)in_stack_fffffffffffffe50,
             (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe48 >> 0x18,0));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffde8);
  local_b0 = Imf_2_5::DeepImage::level
                       ((DeepImage *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        (int)(in_stack_fffffffffffffde8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  pTVar3 = Imf_2_5::DeepImageLevel::typedChannel<float>
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_b8 = pTVar3;
  Imf_2_5::DeepImageLevel::sampleCounts(local_b0);
  local_f8 = 0;
  do {
    uVar9 = local_f8;
    sVar4 = Imf_2_5::ImageChannel::numPixels((ImageChannel *)local_b8);
    if (sVar4 <= uVar9) {
      Imf_2_5::DeepImage::~DeepImage((DeepImage *)0x1201ae);
      return;
    }
    Imath_2_5::Rand48::nexti((Rand48 *)0x11fd15);
    Imf_2_5::ImageChannel::pixelsPerRow((ImageChannel *)local_b8);
    Imath_2_5::Rand48::nexti((Rand48 *)0x11fd66);
    Imf_2_5::ImageChannel::pixelsPerColumn((ImageChannel *)local_b8);
    puVar5 = Imf_2_5::SampleCountChannel::at
                       ((SampleCountChannel *)in_stack_fffffffffffffe00,
                        (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                        (int)in_stack_fffffffffffffdf8);
    local_164 = *puVar5;
    lVar6 = Imath_2_5::Rand48::nexti((Rand48 *)0x11fdd6);
    iVar1 = (int)(lVar6 % 0x15);
    for (local_15c = 0; local_15c < (int)local_164; local_15c = local_15c + 1) {
      pfVar7 = Imf_2_5::TypedDeepImageChannel<float>::operator()
                         ((TypedDeepImageChannel<float> *)in_stack_fffffffffffffe00,
                          (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                          (int)in_stack_fffffffffffffdf8);
      afStack_158[local_15c] = pfVar7[local_15c];
    }
    Imf_2_5::SampleCountChannel::set
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed4);
    if ((int)local_164 < iVar1) {
      for (local_160 = 0; local_160 < (int)local_164; local_160 = local_160 + 1) {
        pfVar7 = Imf_2_5::TypedDeepImageChannel<float>::operator()
                           ((TypedDeepImageChannel<float> *)in_stack_fffffffffffffe00,
                            (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                            (int)in_stack_fffffffffffffdf8);
        if ((pfVar7[local_160] != afStack_158[local_160]) ||
           (NAN(pfVar7[local_160]) || NAN(afStack_158[local_160]))) {
          __assert_fail("channel(x, y)[j] == oldSamples[j]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                        ,0x1e9,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
      }
      for (; (int)local_164 < iVar1; local_164 = local_164 + 1) {
        pfVar7 = Imf_2_5::TypedDeepImageChannel<float>::operator()
                           ((TypedDeepImageChannel<float> *)in_stack_fffffffffffffe00,
                            (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                            (int)in_stack_fffffffffffffdf8);
        if ((pfVar7[(int)local_164] != 0.0) || (NAN(pfVar7[(int)local_164]))) {
          __assert_fail("channel(x, y)[j] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                        ,0x1ed,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
        in_stack_fffffffffffffe00 = (DeepImageLevel *)Imath_2_5::Rand48::nextf((Rand48 *)0x12007d);
        fVar8 = (float)(double)in_stack_fffffffffffffe00;
        in_stack_fffffffffffffdf8 =
             (string *)
             Imf_2_5::TypedDeepImageChannel<float>::operator()
                       ((TypedDeepImageChannel<float> *)in_stack_fffffffffffffe00,
                        (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                        (int)in_stack_fffffffffffffdf8);
        *(float *)(&in_stack_fffffffffffffdf8->_M_dataplus + (long)(int)local_164 * 4) = fVar8;
      }
    }
    else {
      for (local_168 = 0; local_168 < iVar1; local_168 = local_168 + 1) {
        pfVar7 = Imf_2_5::TypedDeepImageChannel<float>::operator()
                           ((TypedDeepImageChannel<float> *)in_stack_fffffffffffffe00,
                            (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                            (int)in_stack_fffffffffffffdf8);
        if ((pfVar7[local_168] != afStack_158[local_168]) ||
           (NAN(pfVar7[local_168]) || NAN(afStack_158[local_168]))) {
          __assert_fail("channel(x, y)[j] == oldSamples[j]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                        ,500,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
      }
    }
    local_f8 = local_f8 + 1;
  } while( true );
}

Assistant:

void
testSetSampleCounts (const Box2i &dataWindow)
{
    cout << "change sample counts, data window = "
            "(" << dataWindow.min.x << ", " << dataWindow.min.y << ") - "
            "(" << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    DeepImage img;
    img.resize (dataWindow, ONE_LEVEL, ROUND_DOWN);
    img.insertChannel ("F", FLOAT, 1, 1, false);

    Rand48 random (0);

    DeepImageLevel &level = img.level();
    DeepFloatChannel &channel = level.typedChannel <float> ("F");
    SampleCountChannel &sampleCounts = level.sampleCounts();

    const int MAX_SAMPLES = 20;

    for (size_t i = 0; i < channel.numPixels(); ++i)
    {
        int x = dataWindow.min.x + random.nexti() % channel.pixelsPerRow();
        int y = dataWindow.min.y + random.nexti() % channel.pixelsPerColumn();

        int oldN = sampleCounts.at (x, y);
        int newN = random.nexti() % (MAX_SAMPLES + 1);

        float oldSamples[MAX_SAMPLES];
        
        for (int j = 0; j < oldN; ++j)
            oldSamples[j] = channel(x, y)[j];

        sampleCounts.set (x, y, newN);

        if (newN > oldN)
        {
            for (int j = 0; j < oldN; ++j)
                assert (channel(x, y)[j] == oldSamples[j]);

            for (int j = oldN; j < newN; ++j)
            {
                assert (channel(x, y)[j] == 0);
                channel(x, y)[j] = random.nextf();
            }
        }
        else
        {
            for (int j = 0; j < newN; ++j)
                assert (channel(x, y)[j] == oldSamples[j]);
        }
    }
}